

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O2

SQRESULT sqstd_register_debuglib(HSQUIRRELVM v)

{
  SQChar *s;
  SQFUNCTION func;
  long lVar1;
  
  for (lVar1 = 0x18; lVar1 != 0xf8; lVar1 = lVar1 + 0x20) {
    s = *(SQChar **)((long)&PTR_typeinfo_name_0019c368 + lVar1);
    func = *(SQFUNCTION *)((long)&PTR_typeinfo_0019c370 + lVar1);
    sq_pushstring(v,s,-1);
    sq_newclosure(v,func,0);
    sq_setparamscheck(v,*(SQInteger *)(&UNK_0019c378 + lVar1),
                      *(SQChar **)((long)&debuglib_funcs[0].name + lVar1));
    sq_setnativeclosurename(v,-1,s);
    sq_newslot(v,-3,0);
  }
  return 0;
}

Assistant:

SQRESULT sqstd_register_debuglib(HSQUIRRELVM v)
{
  SQInteger i = 0;
  while (debuglib_funcs[i].name != 0)
  {
    sq_pushstring(v, debuglib_funcs[i].name, -1);
    sq_newclosure(v, debuglib_funcs[i].f, 0);
    sq_setparamscheck(v, debuglib_funcs[i].nparamscheck, debuglib_funcs[i].typemask);
    sq_setnativeclosurename(v, -1, debuglib_funcs[i].name);
    sq_newslot(v, -3, SQFalse);
    i++;
  }
  return SQ_OK;
}